

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

bool __thiscall Js::FunctionBody::InstallProbe(FunctionBody *this,int offset)

{
  Type *addr;
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  byte *initialContent;
  ArenaAllocator *alloc;
  undefined4 *puVar5;
  ByteBlock *pBVar6;
  
  if ((offset < 0) ||
     (uVar4 = ByteBlock::GetLength((this->byteCodeBlock).ptr), uVar4 <= offset + 1U)) {
    return false;
  }
  initialContent = ByteBlock::GetBuffer((this->byteCodeBlock).ptr);
  if ((this->m_sourceInfo).m_probeBackingBlock.ptr == (ByteBlock *)0x0) {
    alloc = ScriptContext::AllocatorForDiagnostics
                      ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
    if (alloc == (ArenaAllocator *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x100f,"(pArena)","pArena");
      if (!bVar3) goto LAB_0076774c;
      *puVar5 = 0;
    }
    addr = &(this->m_sourceInfo).m_probeBackingBlock;
    uVar4 = ByteBlock::GetLength((this->byteCodeBlock).ptr);
    pBVar6 = ByteBlock::NewFromArena(alloc,initialContent,uVar4);
    Memory::Recycler::WBSetBit((char *)addr);
    (this->m_sourceInfo).m_probeBackingBlock.ptr = pBVar6;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  }
  bVar3 = OpCodeAttr::HasMultiSizeLayout(Break);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1017,"(!OpCodeAttr::HasMultiSizeLayout(OpCode::Break))",
                                "!OpCodeAttr::HasMultiSizeLayout(OpCode::Break)");
    if (!bVar3) {
LAB_0076774c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  initialContent[(uint)offset] = '\b';
  pTVar1 = &(this->m_sourceInfo).m_probeCount;
  *pTVar1 = *pTVar1 + 1;
  return true;
}

Assistant:

bool FunctionBody::InstallProbe(int offset)
    {
        if (offset < 0 || ((uint)offset + 1) >= byteCodeBlock->GetLength())
        {
            return false;
        }

        byte* pbyteCodeBlockBuffer = this->byteCodeBlock->GetBuffer();

        if(!GetProbeBackingBlock())
        {
            // The probe backing block is set on a different thread than the main thread
            // The recycler doesn't like allocations from a different thread, so we allocate
            // the backing byte code block in the arena
            ArenaAllocator *pArena = m_scriptContext->AllocatorForDiagnostics();
            Assert(pArena);
            ByteBlock* probeBackingBlock = ByteBlock::NewFromArena(pArena, pbyteCodeBlockBuffer, byteCodeBlock->GetLength());
            SetProbeBackingBlock(probeBackingBlock);
        }

        // Make sure Break opcode only need one byte
        Assert(OpCodeUtil::IsSmallEncodedOpcode(OpCode::Break));
#if ENABLE_NATIVE_CODEGEN
        Assert(!OpCodeAttr::HasMultiSizeLayout(OpCode::Break));
#endif
        *(byte *)(pbyteCodeBlockBuffer + offset) = (byte)OpCode::Break;

        ++m_sourceInfo.m_probeCount;

        return true;
    }